

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O2

void bcm2835_aux_spi_writenb(char *tbuf,uint32_t len)

{
  uint32_t *paddr;
  uint32_t *puVar1;
  uint32_t *paddr_00;
  uint32_t uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint32_t *puVar7;
  
  puVar7 = bcm2835_spi1 + 1;
  paddr = bcm2835_spi1 + 2;
  puVar1 = bcm2835_spi1 + 0xc;
  paddr_00 = bcm2835_spi1 + 8;
  bcm2835_peri_write(bcm2835_spi1,spi1_speed << 0x14 | 0x64840);
  bcm2835_peri_write(puVar7,2);
  while (len != 0) {
    do {
      uVar2 = bcm2835_peri_read(paddr);
    } while ((uVar2 >> 10 & 1) != 0);
    uVar3 = 3;
    if (len < 3) {
      uVar3 = len;
    }
    uVar5 = 0;
    for (iVar4 = 0x10; uVar3 * 8 + iVar4 != 0x10; iVar4 = iVar4 + -8) {
      if ((byte *)tbuf == (byte *)0x0) {
        tbuf = (char *)0x0;
        uVar6 = 0;
      }
      else {
        uVar6 = (uint)(byte)*tbuf;
        tbuf = (char *)((byte *)tbuf + 1);
      }
      uVar5 = uVar5 | uVar6 << ((byte)iVar4 & 0x1f);
    }
    len = len - uVar3;
    puVar7 = puVar1;
    if (len == 0) {
      puVar7 = paddr_00;
    }
    bcm2835_peri_write(puVar7,uVar5 | uVar3 << 0x1b);
    do {
      uVar2 = bcm2835_peri_read(paddr);
    } while ((uVar2 & 0x40) != 0);
    bcm2835_peri_read(paddr_00);
  }
  return;
}

Assistant:

void bcm2835_aux_spi_writenb(const char *tbuf, uint32_t len) {
    volatile uint32_t* cntl0 = bcm2835_spi1 + BCM2835_AUX_SPI_CNTL0/4;
    volatile uint32_t* cntl1 = bcm2835_spi1 + BCM2835_AUX_SPI_CNTL1/4;
    volatile uint32_t* stat = bcm2835_spi1 + BCM2835_AUX_SPI_STAT/4;
    volatile uint32_t* txhold = bcm2835_spi1 + BCM2835_AUX_SPI_TXHOLD/4;
    volatile uint32_t* io = bcm2835_spi1 + BCM2835_AUX_SPI_IO/4;

    char *tx = (char *) tbuf;
    uint32_t tx_len = len;
    uint32_t count;
    uint32_t data;
    uint32_t i;
    uint8_t byte;

    uint32_t _cntl0 = (spi1_speed << BCM2835_AUX_SPI_CNTL0_SPEED_SHIFT);
    _cntl0 |= BCM2835_AUX_SPI_CNTL0_CS2_N;
    _cntl0 |= BCM2835_AUX_SPI_CNTL0_ENABLE;
    _cntl0 |= BCM2835_AUX_SPI_CNTL0_MSBF_OUT;
    _cntl0 |= BCM2835_AUX_SPI_CNTL0_VAR_WIDTH;

    bcm2835_peri_write(cntl0, _cntl0);
    bcm2835_peri_write(cntl1, BCM2835_AUX_SPI_CNTL1_MSBF_IN);

    while (tx_len > 0) {

	while (bcm2835_peri_read(stat) & BCM2835_AUX_SPI_STAT_TX_FULL)
	    ;

	count = MIN(tx_len, 3);
	data = 0;

	for (i = 0; i < count; i++) {
	    byte = (tx != NULL) ? (uint8_t) *tx++ : (uint8_t) 0;
	    data |= byte << (8 * (2 - i));
	}

	data |= (count * 8) << 24;
	tx_len -= count;

	if (tx_len != 0) {
	    bcm2835_peri_write(txhold, data);
	} else {
	    bcm2835_peri_write(io, data);
	}

	while (bcm2835_peri_read(stat) & BCM2835_AUX_SPI_STAT_BUSY)
	    ;

	(void) bcm2835_peri_read(io);
    }
}